

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

shared_ptr<helics::Core>
helics::CoreFactory::create(CoreType type,string_view coreName,string_view configureString)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  RegistrationFailure *pRVar4;
  undefined4 extraout_var;
  char *pcVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CoreType type_00;
  undefined4 in_register_0000003c;
  shared_ptr<helics::Core> *core;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view name;
  string_view message;
  string_view message_00;
  shared_ptr<helics::Core> sVar6;
  string_view fmt;
  format_args args;
  allocator<char> local_b5;
  CoreType newType;
  string_view configureString_local;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  string local_78;
  string newName;
  string *local_38;
  CoreType *local_30;
  
  core = (shared_ptr<helics::Core> *)CONCAT44(in_register_0000003c,type);
  configureString_local._M_len = (size_t)configureString._M_str;
  pcVar5 = coreName._M_str;
  type_00 = (CoreType)coreName._M_len;
  newName._M_dataplus._M_p = (pointer)&newName.field_2;
  newName._M_string_length = 0;
  newName.field_2._M_local_buf[0] = '\0';
  configureString_local._M_str = (char *)in_R9;
  if (pcVar5 == (char *)0x0 || type_00 == EXTRACT) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_78,&configureString_local,&local_b5);
    helics::core::extractCoreType
              ((pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a0,&local_78);
    local_38 = &newName;
    local_30 = &newType;
    std::tuple<helics::CoreType&,std::__cxx11::string&>::operator=
              ((tuple<helics::CoreType&,std::__cxx11::string&> *)&local_38,
               (pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_a0);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)newName._M_string_length;
    }
    if (type_00 == EXTRACT) {
      type_00 = newType;
    }
  }
  name._M_len = (ulong)type_00;
  name._M_str = pcVar5;
  makeCore(type,name);
  peVar1 = (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pRVar4 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    message._M_str = "unable to create core";
    message._M_len = 0x15;
    RegistrationFailure::RegistrationFailure(pRVar4,message);
    __cxa_throw(pRVar4,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  (*peVar1->_vptr_Core[2])(peVar1,configureString_local._M_len,configureString_local._M_str);
  bVar2 = registerCore(core,type_00);
  if (!bVar2) {
    pRVar4 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    iVar3 = (*((core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_Core[0xc])();
    local_78._M_dataplus._M_p = *(pointer *)CONCAT44(extraout_var,iVar3);
    local_78._M_string_length = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x23;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_78;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)local_a0,(v11 *)"core {} failed to register properly",fmt,args);
    message_00._M_str = (char *)local_a0;
    message_00._M_len = (size_t)local_98._M_p;
    RegistrationFailure::RegistrationFailure(pRVar4,message_00);
    __cxa_throw(pRVar4,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  std::__cxx11::string::~string((string *)&newName);
  sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)core;
  return (shared_ptr<helics::Core>)
         sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core>
    create(CoreType type, std::string_view coreName, std::string_view configureString)
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || coreName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(std::string{configureString});
        if (coreName.empty() && !newName.empty()) {
            coreName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto core = makeCore(type, coreName);
    if (!core) {
        throw(helics::RegistrationFailure("unable to create core"));
    }
    core->configure(configureString);
    if (!registerCore(core, type)) {
        throw(helics::RegistrationFailure(
            fmt::format("core {} failed to register properly", core->getIdentifier())));
    }

    return core;
}